

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor(TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  uint uVar1;
  TFad<6,_double> local_68;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_016acd90;
  local_68.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_68.val_ = 0.0;
  local_68.dx_[0] = 0.0;
  local_68.dx_[1] = 0.0;
  local_68.dx_[2] = 0.0;
  local_68.dx_[3] = 0.0;
  local_68.dx_[4] = 0.0;
  local_68.dx_[5] = 0.0;
  TPZManVector<TFad<6,_double>,_6>::TPZManVector(&this->fData,6,&local_68);
  for (uVar1 = 0; uVar1 < 3;
      uVar1 = uVar1 + (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[uVar1]
      ) {
    TPZTensor<TFad<6,double>>::Add<TFad<6,double>,TFad<6,double>>
              ((TPZTensor<TFad<6,double>> *)this,
               (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore +
               uVar1,(eigensystem->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + uVar1);
  }
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }